

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_features.pb.h
# Opt level: O0

void __thiscall
pb::JavaFeatures_NestInFileClassFeature::~JavaFeatures_NestInFileClassFeature
          (JavaFeatures_NestInFileClassFeature *this)

{
  JavaFeatures_NestInFileClassFeature *this_local;
  
  ~JavaFeatures_NestInFileClassFeature(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

class PROTOC_EXPORT JavaFeatures_NestInFileClassFeature final : public ::google::protobuf::internal::ZeroFieldsBase
/* @@protoc_insertion_point(class_definition:pb.JavaFeatures.NestInFileClassFeature) */ {
 public:
  inline JavaFeatures_NestInFileClassFeature() : JavaFeatures_NestInFileClassFeature(nullptr) {}

#if defined(PROTOBUF_CUSTOM_VTABLE)
  void operator delete(JavaFeatures_NestInFileClassFeature* PROTOBUF_NONNULL msg, std::destroying_delete_t) {
    SharedDtor(*msg);
    ::google::protobuf::internal::SizedDelete(msg, sizeof(JavaFeatures_NestInFileClassFeature));
  }
#endif

  template <typename = void>
  explicit PROTOBUF_CONSTEXPR JavaFeatures_NestInFileClassFeature(::google::protobuf::internal::ConstantInitialized);

  inline JavaFeatures_NestInFileClassFeature(const JavaFeatures_NestInFileClassFeature& from) : JavaFeatures_NestInFileClassFeature(nullptr, from) {}
  inline JavaFeatures_NestInFileClassFeature(JavaFeatures_NestInFileClassFeature&& from) noexcept
      : JavaFeatures_NestInFileClassFeature(nullptr, ::std::move(from)) {}
  inline JavaFeatures_NestInFileClassFeature& operator=(const JavaFeatures_NestInFileClassFeature& from) {
    CopyFrom(from);
    return *this;
  }
  inline JavaFeatures_NestInFileClassFeature& operator=(JavaFeatures_NestInFileClassFeature&& from) noexcept {
    if (this == &from) return *this;
    if (::google::protobuf::internal::CanMoveWithInternalSwap(GetArena(), from.GetArena())) {
      InternalSwap(&from);
    } else {
      CopyFrom(from);
    }
    return *this;
  }

  inline const ::google::protobuf::UnknownFieldSet& unknown_fields() const
      ABSL_ATTRIBUTE_LIFETIME_BOUND {
    return _internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance);
  }
  inline ::google::protobuf::UnknownFieldSet* PROTOBUF_NONNULL mutable_unknown_fields()
      ABSL_ATTRIBUTE_LIFETIME_BOUND {
    return _internal_metadata_.mutable_unknown_fields<::google::protobuf::UnknownFieldSet>();
  }

  static const ::google::protobuf::Descriptor* PROTOBUF_NONNULL descriptor() {
    return GetDescriptor();
  }
  static const ::google::protobuf::Descriptor* PROTOBUF_NONNULL GetDescriptor() {
    return default_instance().GetMetadata().descriptor;
  }
  static const ::google::protobuf::Reflection* PROTOBUF_NONNULL GetReflection() {
    return default_instance().GetMetadata().reflection;
  }
  static const JavaFeatures_NestInFileClassFeature& default_instance() {
    return *reinterpret_cast<const JavaFeatures_NestInFileClassFeature*>(
        &_JavaFeatures_NestInFileClassFeature_default_instance_);
  }
  static constexpr int kIndexInFileMessages = 0;
  friend void swap(JavaFeatures_NestInFileClassFeature& a, JavaFeatures_NestInFileClassFeature& b) { a.Swap(&b); }
  inline void Swap(JavaFeatures_NestInFileClassFeature* PROTOBUF_NONNULL other) {
    if (other == this) return;
    if (::google::protobuf::internal::CanUseInternalSwap(GetArena(), other->GetArena())) {
      InternalSwap(other);
    } else {
      ::google::protobuf::internal::GenericSwap(this, other);
    }
  }
  void UnsafeArenaSwap(JavaFeatures_NestInFileClassFeature* PROTOBUF_NONNULL other) {
    if (other == this) return;
    ABSL_DCHECK(GetArena() == other->GetArena());
    InternalSwap(other);
  }

  // implements Message ----------------------------------------------

  JavaFeatures_NestInFileClassFeature* PROTOBUF_NONNULL New(::google::protobuf::Arena* PROTOBUF_NULLABLE arena = nullptr) const {
    return ::google::protobuf::internal::ZeroFieldsBase::DefaultConstruct<JavaFeatures_NestInFileClassFeature>(arena);
  }